

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleImageTests.cpp
# Opt level: O0

void vkt::pipeline::anon_unknown_0::StorageImage::initPrograms
               (SourceCollections *programCollection,CaseDef *caseDef)

{
  CaseDef *this;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  ProgramSources *this_00;
  int in_ECX;
  TextureFormat *format;
  char *local_318;
  string local_2e8;
  ShaderSource local_2c8;
  allocator<char> local_299;
  string local_298;
  ostringstream local_278 [8];
  ostringstream src;
  allocator<char> local_f9;
  string local_f8 [8];
  string texelCoordStr;
  string gvec4Expr;
  undefined1 local_b0 [8];
  string signednessPrefix;
  TextureFormat local_80;
  undefined1 local_78 [8];
  string formatQualifierStr;
  undefined1 local_50 [8];
  string imageTypeStr;
  CaseDef *caseDef_local;
  SourceCollections *programCollection_local;
  
  this = (CaseDef *)((long)&imageTypeStr.field_2 + 0xc);
  CaseDef::CaseDef(this,caseDef);
  addSimpleVertexAndFragmentPrograms(programCollection,this);
  formatQualifierStr.field_2._8_8_ = ::vk::mapVkFormat(caseDef->colorFormat);
  pipeline::(anonymous_namespace)::getShaderMultisampledImageType_abi_cxx11_
            ((string *)local_50,
             (_anonymous_namespace_ *)(formatQualifierStr.field_2._M_local_buf + 8),
             (TextureFormat *)(ulong)(uint)caseDef->numLayers,in_ECX);
  local_80 = ::vk::mapVkFormat(caseDef->colorFormat);
  pipeline::(anonymous_namespace)::getShaderImageFormatQualifier_abi_cxx11_
            ((string *)local_78,(_anonymous_namespace_ *)&local_80,format);
  bVar1 = ::vk::isUintFormat(caseDef->colorFormat);
  if (bVar1) {
    local_318 = "u";
  }
  else {
    bVar1 = ::vk::isIntFormat(caseDef->colorFormat);
    local_318 = "";
    if (bVar1) {
      local_318 = "i";
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_b0,local_318,(allocator<char> *)(gvec4Expr.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator((allocator<char> *)(gvec4Expr.field_2._M_local_buf + 0xf));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&texelCoordStr.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b0,
                 "vec4");
  pcVar2 = "ivec3(gx, gy, gz)";
  if (caseDef->numLayers == 1) {
    pcVar2 = "ivec2(gx, gy)";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,pcVar2,&local_f9);
  std::allocator<char>::~allocator(&local_f9);
  std::__cxx11::ostringstream::ostringstream(local_278);
  pcVar2 = glu::getGLSLVersionDeclaration(GLSL_VERSION_450);
  poVar3 = std::operator<<((ostream *)local_278,pcVar2);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"layout(local_size_x = 1) in;\n");
  poVar3 = std::operator<<(poVar3,"layout(set = 0, binding = 0, ");
  poVar3 = std::operator<<(poVar3,(string *)local_78);
  poVar3 = std::operator<<(poVar3,") uniform ");
  poVar3 = std::operator<<(poVar3,(string *)local_50);
  poVar3 = std::operator<<(poVar3," u_msImage;\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"void main(void)\n");
  poVar3 = std::operator<<(poVar3,"{\n");
  poVar3 = std::operator<<(poVar3,"    int gx = int(gl_GlobalInvocationID.x);\n");
  poVar3 = std::operator<<(poVar3,"    int gy = int(gl_GlobalInvocationID.y);\n");
  poVar3 = std::operator<<(poVar3,"    int gz = int(gl_GlobalInvocationID.z);\n");
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"    ");
  poVar3 = std::operator<<(poVar3,(string *)(texelCoordStr.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," prevColor = imageLoad(u_msImage, ");
  poVar3 = std::operator<<(poVar3,local_f8);
  poVar3 = std::operator<<(poVar3,", 0);\n");
  poVar3 = std::operator<<(poVar3,"    for (int sampleNdx = 1; sampleNdx < ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,caseDef->numSamples);
  poVar3 = std::operator<<(poVar3,"; ++sampleNdx) {\n");
  poVar3 = std::operator<<(poVar3,"        ");
  poVar3 = std::operator<<(poVar3,(string *)(texelCoordStr.field_2._M_local_buf + 8));
  poVar3 = std::operator<<(poVar3," color = imageLoad(u_msImage, ");
  poVar3 = std::operator<<(poVar3,local_f8);
  poVar3 = std::operator<<(poVar3,", sampleNdx);\n");
  poVar3 = std::operator<<(poVar3,"        imageStore(u_msImage, ");
  poVar3 = std::operator<<(poVar3,local_f8);
  poVar3 = std::operator<<(poVar3,", sampleNdx, prevColor);\n");
  poVar3 = std::operator<<(poVar3,"        prevColor = color;\n");
  poVar3 = std::operator<<(poVar3,"    }\n");
  poVar3 = std::operator<<(poVar3,"    imageStore(u_msImage, ");
  poVar3 = std::operator<<(poVar3,local_f8);
  poVar3 = std::operator<<(poVar3,", 0, prevColor);\n");
  std::operator<<(poVar3,"}\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_298,"comp",&local_299);
  this_00 = ::vk::ProgramCollection<glu::ProgramSources>::add
                      (&programCollection->glslSources,&local_298);
  std::__cxx11::ostringstream::str();
  glu::ComputeSource::ComputeSource((ComputeSource *)&local_2c8,&local_2e8);
  glu::ProgramSources::operator<<(this_00,&local_2c8);
  glu::ComputeSource::~ComputeSource((ComputeSource *)&local_2c8);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_298);
  std::allocator<char>::~allocator(&local_299);
  std::__cxx11::ostringstream::~ostringstream(local_278);
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string((string *)(texelCoordStr.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_50);
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection, const CaseDef caseDef)
{
	// Vertex & fragment

	addSimpleVertexAndFragmentPrograms(programCollection, caseDef);

	// Compute
	{
		const std::string	imageTypeStr		= getShaderMultisampledImageType(mapVkFormat(caseDef.colorFormat), caseDef.numLayers);
		const std::string	formatQualifierStr	= getShaderImageFormatQualifier(mapVkFormat(caseDef.colorFormat));
		const std::string	signednessPrefix	= isUintFormat(caseDef.colorFormat) ? "u" : isIntFormat(caseDef.colorFormat) ? "i" : "";
		const std::string	gvec4Expr			= signednessPrefix + "vec4";
		const std::string	texelCoordStr		= (caseDef.numLayers == 1 ? "ivec2(gx, gy)" : "ivec3(gx, gy, gz)");

		std::ostringstream src;
		src << glu::getGLSLVersionDeclaration(glu::GLSL_VERSION_450) << "\n"
			<< "layout(local_size_x = 1) in;\n"
			<< "layout(set = 0, binding = 0, " << formatQualifierStr << ") uniform " << imageTypeStr << " u_msImage;\n"
			<< "\n"
			<< "void main(void)\n"
			<< "{\n"
			<< "    int gx = int(gl_GlobalInvocationID.x);\n"
			<< "    int gy = int(gl_GlobalInvocationID.y);\n"
			<< "    int gz = int(gl_GlobalInvocationID.z);\n"
			<< "\n"
			<< "    " << gvec4Expr << " prevColor = imageLoad(u_msImage, " << texelCoordStr << ", 0);\n"
			<< "    for (int sampleNdx = 1; sampleNdx < " << caseDef.numSamples << "; ++sampleNdx) {\n"
			<< "        " << gvec4Expr << " color = imageLoad(u_msImage, " << texelCoordStr << ", sampleNdx);\n"
			<< "        imageStore(u_msImage, " << texelCoordStr <<", sampleNdx, prevColor);\n"
			<< "        prevColor = color;\n"
			<< "    }\n"
			<< "    imageStore(u_msImage, " << texelCoordStr <<", 0, prevColor);\n"
			<< "}\n";

		programCollection.glslSources.add("comp") << glu::ComputeSource(src.str());
	}
}